

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec75.c
# Opt level: O2

int If_CutPerformCheck75__(If_Man_t *p,uint *pTruth,int nVars,int nLeaves,char *pStr)

{
  ulong uVar1;
  word wVar2;
  word wVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  long lVar8;
  ulong uVar9;
  word *pTruth_00;
  long lVar10;
  word *pT;
  char *in_stack_fffffffffffffbb8;
  int nVarsMin;
  word pCof1 [2];
  word pCof0 [2];
  char pDsdStr [1000];
  
  If_CutPerformCheck75__::Counter = If_CutPerformCheck75__::Counter + 1;
  uVar5 = 1;
  if (5 < nLeaves) {
    if (8 < (uint)nLeaves) {
      __assert_fail("nLeaves <= 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec75.c"
                    ,0xd4,"int If_CutPerformCheck75__(If_Man_t *, unsigned int *, int, int, char *)"
                   );
    }
    if (nLeaves == 8) {
      uVar5 = 0;
      iVar4 = Dau_DsdDecompose((word *)pTruth,8,0,0,pDsdStr);
      if (iVar4 < 5) {
        uVar5 = Dau_DsdCheckDecAndExist(pDsdStr);
        uVar5 = uVar5 >> 4 & 1;
      }
    }
    else {
      iVar4 = If_CutPerformCheck16(p,pTruth,nVars,nLeaves,"44");
      if (iVar4 == 0) {
        uVar9 = (ulong)(uint)nLeaves;
        iVar4 = Dau_DsdDecompose((word *)pTruth,nLeaves,0,0,pDsdStr);
        if (nLeaves == 7) {
          if (iVar4 < 5) {
            uVar5 = Dau_DsdCheckDecExist(in_stack_fffffffffffffbb8);
            if ((uVar5 & 0x10) != 0) {
              return 1;
            }
            uVar5 = Dau_DsdCheckDecAndExist(pDsdStr);
            if ((uVar5 & 0x18) != 0) {
              return 1;
            }
          }
          uVar5 = 0;
          for (lVar10 = 0; lVar10 != 7; lVar10 = lVar10 + 1) {
            pCof1[0] = *(word *)pTruth;
            pCof0[0] = pCof1[0];
            pCof1[1] = *(word *)(pTruth + 2);
            pCof0[1] = pCof1[1];
            wVar2 = pCof1[1];
            wVar3 = pCof1[0];
            if (lVar10 != 6) {
              uVar9 = s_Truths6Neg[lVar10];
              for (lVar8 = 0; bVar7 = (byte)(1 << ((byte)lVar10 & 0x1f)), lVar8 != 2;
                  lVar8 = lVar8 + 1) {
                pCof0[lVar8] = (pCof0[lVar8] & uVar9) << (bVar7 & 0x3f) | pCof0[lVar8] & uVar9;
              }
              uVar1 = s_Truths6[lVar10];
              for (uVar9 = 0; wVar2 = pCof1[0], wVar3 = pCof0[1], uVar9 != 2; uVar9 = uVar9 + 1) {
                pCof1[uVar9] = (pCof1[uVar9] & uVar1) >> (bVar7 & 0x3f) | pCof1[uVar9] & uVar1;
              }
            }
            pCof0[1] = wVar3;
            pCof1[0] = wVar2;
            iVar4 = Abc_TtSupportSize(pCof0,(int)uVar9);
            if (iVar4 < 4) {
              If_Dec7MinimumBase(pCof1,(int *)0x0,7,&nVarsMin);
              pTruth_00 = pCof1;
LAB_00382767:
              uVar9 = (ulong)(uint)nVarsMin;
              iVar4 = Dau_DsdDecompose(pTruth_00,nVarsMin,0,0,pDsdStr);
              if ((iVar4 < 5) &&
                 (uVar6 = Dau_DsdCheckDecExist(in_stack_fffffffffffffbb8), (uVar6 & 0x18) != 0)) {
                return 1;
              }
            }
            else {
              iVar4 = Abc_TtSupportSize(pCof1,(int)uVar9);
              if (iVar4 < 4) {
                If_Dec7MinimumBase(pCof0,(int *)0x0,7,&nVarsMin);
                pTruth_00 = pCof0;
                goto LAB_00382767;
              }
            }
          }
        }
        else if ((4 < iVar4) ||
                ((uVar6 = Dau_DsdCheckDecExist(in_stack_fffffffffffffbb8), (uVar6 & 0x18) == 0 &&
                 (uVar6 = Dau_DsdCheckDecAndExist(pDsdStr), (uVar6 & 0x1c) == 0)))) {
          uVar5 = If_CutPerformCheck07(p,pTruth,nVars,6,pStr);
        }
      }
    }
  }
  return uVar5;
}

Assistant:

int If_CutPerformCheck75__( If_Man_t * p, unsigned * pTruth, int nVars, int nLeaves, char * pStr )
{
    char pDsdStr[1000];
    int nSizeNonDec, nDecExists, nDecAndExists;
    static int Counter = 0;
    Counter++;
    if ( nLeaves < 6 )
        return 1;
    assert( nLeaves <= 8 );
    if ( nLeaves < 8 && If_CutPerformCheck16( p, pTruth, nVars, nLeaves, "44" ) )
        return 1;
    // check decomposability
    nSizeNonDec = Dau_DsdDecompose( (word *)pTruth, nLeaves, 0, 0, pDsdStr );
//    printf( "Vars = %d  %s", nLeaves, pDsdStr );    printf( "\n" );
//    Extra_PrintBinary( stdout, &nDecExists, 8 );    printf( "\n" );
//    Extra_PrintBinary( stdout, &nDecAndExists, 8 ); printf( "\n" );
    if ( nLeaves == 8 )
    {
        if ( nSizeNonDec >= 5 )
            return 0;
        nDecAndExists = Dau_DsdCheckDecAndExist( pDsdStr );
        if ( nDecAndExists & 0x10 ) // bit 4
            return 1;
        else
            return 0;
    }
    if ( nLeaves == 7 )
    {
        extern void If_Dec7MinimumBase( word uTruth[2], int * pSupp, int nVarsAll, int * pnVars );
        word * pT = (word *)pTruth;
        word pCof0[2], pCof1[2];
        int v, nVarsMin;
        if ( nSizeNonDec < 5 )
        {
            nDecExists = Dau_DsdCheckDecExist( pDsdStr );
            if ( nDecExists & 0x10 ) // bit 4
                return 1;
            nDecAndExists = Dau_DsdCheckDecAndExist( pDsdStr );
            if ( nDecAndExists & 0x18 ) // bit 4, 3
                return 1;
        }
        // check cofactors
        for ( v = 0; v < 7; v++ )
        {
            pCof0[0] = pCof1[0] = pT[0];
            pCof0[1] = pCof1[1] = pT[1];
            Abc_TtCofactor0( pCof0, 2, v );
            Abc_TtCofactor1( pCof1, 2, v );
            if ( Abc_TtSupportSize(pCof0, 7) < 4 )
            {
                If_Dec7MinimumBase( pCof1, NULL, 7, &nVarsMin );
                nSizeNonDec = Dau_DsdDecompose( pCof1, nVarsMin, 0, 0, pDsdStr );
                if ( nSizeNonDec >= 5 )
                    continue;
                nDecExists = Dau_DsdCheckDecExist( pDsdStr );
                if ( nDecExists & 0x18 ) // bit 4, 3
                    return 1;
            }
            else if ( Abc_TtSupportSize(pCof1, 7) < 4 )
            {
                If_Dec7MinimumBase( pCof0, NULL, 7, &nVarsMin );
                nSizeNonDec = Dau_DsdDecompose( pCof0, nVarsMin, 0, 0, pDsdStr );
                if ( nSizeNonDec >= 5 )
                    continue;
                nDecExists = Dau_DsdCheckDecExist( pDsdStr );
                if ( nDecExists & 0x18 ) // bit 4, 3
                    return 1;
            }
        }
        return 0;
    }
    if ( nLeaves == 6 )
    {
        if ( nSizeNonDec < 5 )
        {
            nDecExists = Dau_DsdCheckDecExist( pDsdStr );
            if ( nDecExists & 0x18 ) // bit 4, 3
                return 1;
            nDecAndExists = Dau_DsdCheckDecAndExist( pDsdStr );
            if ( nDecAndExists & 0x1C ) // bit 4, 3, 2
                return 1;
        }
        return If_CutPerformCheck07( p, pTruth, nVars, nLeaves, pStr );
    }
    assert( 0 );
    return 0;
}